

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O0

void __thiscall
QOpenGLTextureHelper::qt_TextureSubImage3D
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLint level,
          GLint xoffset,GLint yoffset,GLint zoffset,GLsizei width,GLsizei height,GLsizei depth,
          GLenum format,GLenum type,GLvoid *pixels)

{
  GLsizei unaff_EBX;
  GLvoid *unaff_RBP;
  undefined8 in_RDI;
  undefined4 in_R9D;
  GLenum unaff_R14D;
  GLenum unaff_R15D;
  long in_FS_OFFSET;
  TextureBinder binder;
  GLenum in_stack_ffffffffffffff6c;
  GLenum in_stack_ffffffffffffff70;
  GLuint in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 *puVar1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined8 local_38;
  GLsizei width_00;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  width_00 = -0x55555556;
  puVar1 = &local_38;
  anon_unknown.dwarf_18e721::TextureBinder::TextureBinder
            ((TextureBinder *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  glTexSubImage3D((QOpenGLTextureHelper *)CONCAT44(in_R9D,in_stack_ffffffffffffffa8),
                  (GLenum)((ulong)puVar1 >> 0x20),(GLint)puVar1,(GLint)((ulong)in_RDI >> 0x20),
                  (GLint)in_RDI,xoffset,width_00,(GLsizei)lVar2,unaff_EBX,unaff_R14D,unaff_R15D,
                  unaff_RBP);
  anon_unknown.dwarf_18e721::TextureBinder::~TextureBinder((TextureBinder *)0x1a7fab);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureSubImage3D(GLuint texture, GLenum target, GLenum bindingTarget, GLint level, GLint xoffset, GLint yoffset, GLint zoffset, GLsizei width, GLsizei height, GLsizei depth, GLenum format, GLenum type, const GLvoid *pixels)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    glTexSubImage3D(target, level, xoffset, yoffset, zoffset, width, height, depth, format, type, pixels);
}